

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O3

const_iterator __thiscall
libcellml::Importer::ImporterImpl::findImportSource
          (ImporterImpl *this,ImportSourcePtr *importSource)

{
  shared_ptr<libcellml::ImportSource> *psVar1;
  element_type *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  bool bVar2;
  _Atomic_word _Var3;
  long lVar4;
  __normal_iterator<const_std::shared_ptr<libcellml::ImportSource>_*,_std::vector<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>_>
  __it;
  long lVar5;
  __normal_iterator<const_std::shared_ptr<libcellml::ImportSource>_*,_std::vector<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>_>
  __it_00;
  
  __it_00._M_current =
       (this->mImports).
       super__Vector_base<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->mImports).
           super__Vector_base<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = (importSource->super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr;
  this_01 = (importSource->super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
      if (__libc_single_threaded != '\0') goto LAB_0021aed5;
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
      if (__libc_single_threaded != '\0') {
        _Var3 = this_01->_M_use_count;
        goto LAB_0021aedd;
      }
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
      if (__libc_single_threaded != '\0') {
        _Var3 = this_01->_M_use_count;
        goto LAB_0021aee2;
      }
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
LAB_0021aed5:
      _Var3 = this_01->_M_use_count + 1;
      this_01->_M_use_count = _Var3;
LAB_0021aedd:
      _Var3 = _Var3 + 1;
      this_01->_M_use_count = _Var3;
LAB_0021aee2:
      this_01->_M_use_count = _Var3 + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  lVar5 = (long)psVar1 - (long)__it_00._M_current;
  if (0 < lVar5 >> 6) {
    lVar4 = (lVar5 >> 6) + 1;
    do {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<libcellml::Importer::ImporterImpl::findImportSource(std::shared_ptr<libcellml::ImportSource>const&)const::$_0>
              ::operator()((_Iter_pred<libcellml::Importer::ImporterImpl::findImportSource(std::shared_ptr<libcellml::ImportSource>const&)const::__0>
                            *)this_00,__it_00);
      __it._M_current = __it_00._M_current;
      if (bVar2) goto LAB_0021afe2;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<libcellml::Importer::ImporterImpl::findImportSource(std::shared_ptr<libcellml::ImportSource>const&)const::$_0>
              ::operator()((_Iter_pred<libcellml::Importer::ImporterImpl::findImportSource(std::shared_ptr<libcellml::ImportSource>const&)const::__0>
                            *)this_00,__it_00._M_current + 1);
      __it._M_current = __it_00._M_current + 1;
      if (bVar2) goto LAB_0021afe2;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<libcellml::Importer::ImporterImpl::findImportSource(std::shared_ptr<libcellml::ImportSource>const&)const::$_0>
              ::operator()((_Iter_pred<libcellml::Importer::ImporterImpl::findImportSource(std::shared_ptr<libcellml::ImportSource>const&)const::__0>
                            *)this_00,__it_00._M_current + 2);
      __it._M_current = __it_00._M_current + 2;
      if (bVar2) goto LAB_0021afe2;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<libcellml::Importer::ImporterImpl::findImportSource(std::shared_ptr<libcellml::ImportSource>const&)const::$_0>
              ::operator()((_Iter_pred<libcellml::Importer::ImporterImpl::findImportSource(std::shared_ptr<libcellml::ImportSource>const&)const::__0>
                            *)this_00,__it_00._M_current + 3);
      __it._M_current = __it_00._M_current + 3;
      if (bVar2) goto LAB_0021afe2;
      __it_00._M_current = __it_00._M_current + 4;
      lVar4 = lVar4 + -1;
      lVar5 = lVar5 + -0x40;
    } while (1 < lVar4);
  }
  lVar5 = lVar5 >> 4;
  if (lVar5 != 1) {
    __it._M_current = __it_00._M_current;
    if (lVar5 != 2) {
      __it._M_current = psVar1;
      if ((lVar5 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<libcellml::Importer::ImporterImpl::findImportSource(std::shared_ptr<libcellml::ImportSource>const&)const::$_0>
                  ::operator()((_Iter_pred<libcellml::Importer::ImporterImpl::findImportSource(std::shared_ptr<libcellml::ImportSource>const&)const::__0>
                                *)this_00,__it_00), __it._M_current = __it_00._M_current, bVar2))
      goto LAB_0021afe2;
      __it._M_current = __it_00._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<libcellml::Importer::ImporterImpl::findImportSource(std::shared_ptr<libcellml::ImportSource>const&)const::$_0>
            ::operator()((_Iter_pred<libcellml::Importer::ImporterImpl::findImportSource(std::shared_ptr<libcellml::ImportSource>const&)const::__0>
                          *)this_00,__it);
    if (bVar2) goto LAB_0021afe2;
    __it_00._M_current = __it._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<libcellml::Importer::ImporterImpl::findImportSource(std::shared_ptr<libcellml::ImportSource>const&)const::$_0>
          ::operator()((_Iter_pred<libcellml::Importer::ImporterImpl::findImportSource(std::shared_ptr<libcellml::ImportSource>const&)const::__0>
                        *)this_00,__it_00);
  __it._M_current = psVar1;
  if (bVar2) {
    __it._M_current = __it_00._M_current;
  }
LAB_0021afe2:
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  return (const_iterator)__it._M_current;
}

Assistant:

bool Importer::addModel(const ModelPtr &model, const std::string &key)
{
    auto normalisedKey = normaliseDirectorySeparator(key);
    if (pFunc()->mLibrary.count(normalisedKey) != 0) {
        // If the key already exists in the library, do nothing.
        return false;
    }
    pFunc()->mLibrary.insert(std::make_pair(normalisedKey, model));
    return true;
}